

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

void __thiscall ProcessThread::run(ProcessThread *this)

{
  int iVar1;
  Process *this_00;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  int iVar4;
  ssize_t sVar5;
  int *piVar6;
  _Base_ptr p_Var7;
  Event *event;
  __node_base_ptr p_Var8;
  uint *puVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  uint uVar12;
  iterator __position;
  __node_base_ptr p_Var13;
  EventLoop *this_01;
  bool bVar14;
  char ch;
  int ret;
  pid_t p;
  unique_lock<std::mutex> lock;
  char local_99;
  uint local_98;
  __pid_t local_94;
  _Base_ptr local_90;
  unique_lock<std::mutex> local_88;
  anon_union_8_2_1a2b307e_for_Flags<LogOutput::LogFlag>_1 local_78;
  Log local_70;
  Log local_60;
  Log local_50;
  Log local_40;
  
  local_90 = &sProcesses._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    do {
      sVar5 = read(sProcessPipe[0],&local_99,1);
    } while (sVar5 != 1);
    if (local_99 == 's') {
      return;
    }
    local_88._M_device = &sProcessMutex;
    local_88._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_88);
    local_88._M_owns = true;
    bVar11 = false;
LAB_0017158c:
    do {
      local_94 = waitpid(0,(int *)&local_98,1);
      if (local_94 == -1) {
        piVar6 = __errno_location();
        if (*piVar6 == 4) goto LAB_0017158c;
        bVar11 = true;
        piVar6 = __errno_location();
        if (*piVar6 != 10) {
          local_78.mValue = 1;
          Log::Log(&local_70,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_78);
          Log::write(&local_60,(int)&local_70,"waitpid error",0xffffffff);
          Log::addStringStream<int>(&local_40,(int)&local_60);
          if (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
        }
      }
      else if (local_94 == 0) {
        bVar11 = true;
      }
      else {
        uVar12 = -(uint)((local_98 & 0x7f) != 0) | local_98 >> 8 & 0xff;
        p_Var7 = local_90;
        if (sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          p_Var7 = &sProcesses._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var10 = sProcesses._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            if (local_94 <= (int)p_Var10[1]._M_color) {
              p_Var7 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < local_94];
          } while (p_Var10 != (_Base_ptr)0x0);
        }
        __position._M_node = local_90;
        if ((p_Var7 != local_90) &&
           (__position._M_node = &sProcesses._M_t._M_impl.super__Rb_tree_header._M_header,
           (int)p_Var7[1]._M_color <= local_94)) {
          __position._M_node = p_Var7;
        }
        local_98 = uVar12;
        if (__position._M_node == local_90) {
          if (sPending == 0) {
            local_78.mValue = 1;
            Log::Log(&local_70,LogLevel::Error,(Flags<LogOutput::LogFlag> *)&local_78);
            Log::write(&local_60,(int)&local_70,"couldn\'t find process for pid",0xffffffff);
            Log::addStringStream<int>(&local_50,(int)&local_60);
            if (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_50.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_60.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_70.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          else {
            p_Var2 = sPendingPids._M_h._M_buckets
                     [(ulong)(long)local_94 % sPendingPids._M_h._M_bucket_count];
            p_Var8 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var8 = p_Var2, p_Var13 = p_Var2->_M_nxt,
               local_94 != *(int *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
                p_Var8 = (__node_base_ptr)0x0;
                if (((ulong)(long)*(int *)&p_Var3[1]._M_nxt % sPendingPids._M_h._M_bucket_count !=
                     (ulong)(long)local_94 % sPendingPids._M_h._M_bucket_count) ||
                   (p_Var8 = p_Var13, p_Var13 = p_Var3, local_94 == *(int *)&p_Var3[1]._M_nxt))
                goto LAB_001718ab;
              }
              p_Var8 = (__node_base_ptr)0x0;
            }
LAB_001718ab:
            if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
              __assert_fail("sPendingPids.find(p) == sPendingPids.end()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Process.cpp"
                            ,0xcc,"virtual void ProcessThread::run()");
            }
            puVar9 = (uint *)std::__detail::
                             _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                           *)&sPendingPids,&local_94);
            *puVar9 = uVar12;
          }
        }
        else {
          this_00 = (Process *)__position._M_node[1]._M_parent;
          if (this_00 != (Process *)0x0) {
            p_Var7 = __position._M_node[1]._M_right;
            if (p_Var7 != (_Base_ptr)0x0) {
              iVar4 = *(int *)&p_Var7->_M_parent;
              do {
                if (iVar4 == 0) {
                  p_Var7 = (_Base_ptr)0x0;
                  break;
                }
                LOCK();
                iVar1 = *(int *)&p_Var7->_M_parent;
                bVar14 = iVar4 == iVar1;
                if (bVar14) {
                  *(int *)&p_Var7->_M_parent = iVar4 + 1;
                  iVar1 = iVar4;
                }
                iVar4 = iVar1;
                UNLOCK();
              } while (!bVar14);
            }
            if (p_Var7 == (_Base_ptr)0x0) {
              bVar14 = true;
            }
            else {
              bVar14 = *(int *)&p_Var7->_M_parent == 0;
            }
            if (bVar14) {
              this_01 = (EventLoop *)0x0;
            }
            else {
              this_01 = (EventLoop *)__position._M_node[1]._M_left;
            }
            std::
            _Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
            ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ProcessThread::ProcessData>,std::_Select1st<std::pair<int_const,ProcessThread::ProcessData>>,std::less<int>,std::allocator<std::pair<int_const,ProcessThread::ProcessData>>>
                                *)&sProcesses,__position);
            std::unique_lock<std::mutex>::unlock(&local_88);
            uVar12 = local_98;
            if (this_01 == (EventLoop *)0x0) {
              Process::finish(this_00,local_98);
            }
            else {
              event = (Event *)operator_new(0x20);
              event->_vptr_Event = (_func_int **)&PTR__Event_001917c8;
              event[1]._vptr_Event = (_func_int **)this_00;
              *(uint *)&event[2]._vptr_Event = uVar12;
              EventLoop::post(this_01,event);
            }
            std::unique_lock<std::mutex>::lock(&local_88);
            if (p_Var7 != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7);
            }
          }
        }
      }
    } while (!bVar11);
    std::unique_lock<std::mutex>::~unique_lock(&local_88);
  } while( true );
}

Assistant:

void ProcessThread::run()
{
    ssize_t r;
    for (;;) {
        char ch;
        r = ::read(sProcessPipe[0], &ch, sizeof(char));
        if (r == 1) {
            if (ch == 's') {
                break;
            } else {
                int ret;
                pid_t p;
                std::unique_lock<std::mutex> lock(sProcessMutex);
                bool done = false;
                do {
                    // find out which process we're waking up on
                    eintrwrap(p, ::waitpid(0, &ret, WNOHANG));
                    switch (p) {
                    case 0:
                        // we're done
                        done = true;
                        break;
                    case -1:
                        done = true;
                        if (errno == ECHILD)
                            break;
                        // this is bad
                        error() << "waitpid error" << errno;
                        break;
                    default:
                        // printf("successfully waited for pid (got %d)\n", p);
                        // child process with pid=p just exited.
                        if (WIFEXITED(ret)) {
                            ret = WEXITSTATUS(ret);
                        } else {
                            ret = Process::ReturnCrashed;
                        }
                        // find the process object to this child process
                        auto proc = sProcesses.find(p);
                        if (proc != sProcesses.end()) {
                            Process *process = proc->second.proc;
                            if (process != nullptr) {
                                EventLoop::SharedPtr loop = proc->second.loop.lock();
                                sProcesses.erase(proc++);
                                lock.unlock();
                                if (loop) {
                                    loop->callLater([process, ret]() { process->finish(ret); });
                                } else {
                                    process->finish(ret);
                                }
                                lock.lock();
                            }
                        } else {
                            if (sPending) {
                                assert(sPendingPids.find(p) == sPendingPids.end());
                                sPendingPids[p] = ret;
                            } else {
                                error() << "couldn't find process for pid" << p;
                            }
                        }
                    }
                } while (!done);
            }
        }
    }
    // printf("process thread died for some reason\n");
}